

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitFactor.c
# Opt level: O3

Kit_Edge_t Kit_SopFactor_rec(Kit_Graph_t *pFForm,Kit_Sop_t *cSop,int nLits,Vec_Int_t *vMemory)

{
  int iVar1;
  Kit_Edge_t KVar2;
  Kit_Edge_t KVar3;
  Kit_Sop_t *cResult;
  Kit_Sop_t Div;
  Kit_Sop_t Rem;
  Kit_Sop_t Quo;
  Kit_Sop_t Com;
  Kit_Sop_t local_70;
  Kit_Sop_t local_60;
  Kit_Sop_t local_50;
  Kit_Sop_t local_40;
  
  if (cSop->nCubes < 1) {
    __assert_fail("Kit_SopCubeNum(cSop) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitFactor.c"
                  ,0x73,"Kit_Edge_t Kit_SopFactor_rec(Kit_Graph_t *, Kit_Sop_t *, int, Vec_Int_t *)"
                 );
  }
  iVar1 = Kit_SopDivisor(&local_70,cSop,nLits,vMemory);
  if (iVar1 == 0) {
    KVar3 = Kit_SopFactorTrivial_rec(pFForm,cSop->pCubes,cSop->nCubes,nLits);
  }
  else {
    Kit_SopDivideInternal(cSop,&local_70,&local_50,&local_60,vMemory);
    if (local_50.nCubes < 1) {
      __assert_fail("Kit_SopCubeNum(cQuo) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitFactor.c"
                    ,0x7d,
                    "Kit_Edge_t Kit_SopFactor_rec(Kit_Graph_t *, Kit_Sop_t *, int, Vec_Int_t *)");
    }
    if (local_50.nCubes == 1) {
      cResult = &local_50;
    }
    else {
      Kit_SopMakeCubeFree(&local_50);
      Kit_SopDivideInternal(cSop,&local_50,&local_70,&local_60,vMemory);
      iVar1 = Kit_SopIsCubeFree(&local_70);
      if (iVar1 != 0) {
        KVar3 = Kit_SopFactor_rec(pFForm,&local_70,nLits,vMemory);
        KVar2 = Kit_SopFactor_rec(pFForm,&local_50,nLits,vMemory);
        KVar3 = Kit_GraphAddNodeAnd(pFForm,KVar3,KVar2);
        if (local_60.nCubes == 0) {
          return KVar3;
        }
        KVar2 = Kit_SopFactor_rec(pFForm,&local_60,nLits,vMemory);
        KVar3 = Kit_GraphAddNodeOr(pFForm,KVar3,KVar2);
        return KVar3;
      }
      cResult = &local_40;
      Kit_SopCommonCubeCover(cResult,&local_70,vMemory);
    }
    KVar3 = Kit_SopFactorLF_rec(pFForm,cSop,cResult,nLits,vMemory);
  }
  return KVar3;
}

Assistant:

Kit_Edge_t Kit_SopFactor_rec( Kit_Graph_t * pFForm, Kit_Sop_t * cSop, int nLits, Vec_Int_t * vMemory )
{
    Kit_Sop_t Div, Quo, Rem, Com;
    Kit_Sop_t * cDiv = &Div, * cQuo = &Quo, * cRem = &Rem, * cCom = &Com;
    Kit_Edge_t eNodeDiv, eNodeQuo, eNodeRem, eNodeAnd;

    // make sure the cover contains some cubes
    assert( Kit_SopCubeNum(cSop) > 0 );

    // get the divisor
    if ( !Kit_SopDivisor(cDiv, cSop, nLits, vMemory) )
        return Kit_SopFactorTrivial( pFForm, cSop, nLits );

    // divide the cover by the divisor
    Kit_SopDivideInternal( cSop, cDiv, cQuo, cRem, vMemory );

    // check the trivial case
    assert( Kit_SopCubeNum(cQuo) > 0 );
    if ( Kit_SopCubeNum(cQuo) == 1 )
        return Kit_SopFactorLF_rec( pFForm, cSop, cQuo, nLits, vMemory );

    // make the quotient cube ABC_FREE
    Kit_SopMakeCubeFree( cQuo );

    // divide the cover by the quotient
    Kit_SopDivideInternal( cSop, cQuo, cDiv, cRem, vMemory );

    // check the trivial case
    if ( Kit_SopIsCubeFree( cDiv ) )
    {
        eNodeDiv = Kit_SopFactor_rec( pFForm, cDiv, nLits, vMemory );
        eNodeQuo = Kit_SopFactor_rec( pFForm, cQuo, nLits, vMemory );
        eNodeAnd = Kit_GraphAddNodeAnd( pFForm, eNodeDiv, eNodeQuo );
        if ( Kit_SopCubeNum(cRem) == 0 )
            return eNodeAnd;
        eNodeRem = Kit_SopFactor_rec( pFForm, cRem, nLits, vMemory );
        return Kit_GraphAddNodeOr( pFForm, eNodeAnd, eNodeRem );
    }

    // get the common cube
    Kit_SopCommonCubeCover( cCom, cDiv, vMemory );

    // solve the simple problem
    return Kit_SopFactorLF_rec( pFForm, cSop, cCom, nLits, vMemory );
}